

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error TT_Vary_Apply_Glyph_Deltas
                   (TT_Face face,FT_UInt glyph_index,FT_Outline *outline,FT_UInt n_points)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  FT_ULong *pFVar4;
  FT_UInt delta_cnt;
  undefined8 uVar5;
  FT_Fixed *pFVar6;
  uint uVar7;
  GX_Blend pGVar8;
  FT_Outline *pFVar9;
  FT_UShort FVar10;
  FT_UShort FVar11;
  FT_Vector *pFVar12;
  FT_Bool *pFVar13;
  uchar *puVar14;
  FT_Fixed FVar15;
  FT_UShort *pFVar16;
  uchar *puVar17;
  FT_Memory pFVar18;
  long lVar19;
  long lVar20;
  FT_Fixed *pFVar21;
  uint uVar22;
  long lVar23;
  FT_Vector *pFVar24;
  long *plVar25;
  long *plVar26;
  FT_Vector *pFVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  FT_Stream pFVar31;
  FT_Fixed *tuple_coords;
  FT_Error error;
  FT_UInt spoint_count;
  FT_UInt point_count;
  FT_Error local_138;
  FT_UShort local_132;
  FT_Memory local_130;
  FT_Vector *local_128;
  FT_Short *local_120;
  FT_Fixed *local_118;
  FT_Fixed *local_110;
  ulong local_108;
  GX_Blend local_100;
  ulong local_f8;
  FT_Bool *local_f0;
  FT_Vector *local_e8;
  FT_Stream local_e0;
  FT_UInt local_d8;
  uint local_d4;
  FT_UShort *local_d0;
  FT_Short *local_c8;
  FT_UShort *local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  FT_Fixed *local_a0;
  ulong local_98;
  FT_Outline *local_90;
  FT_Fixed local_88;
  long local_80;
  long local_78;
  long local_70;
  ulong local_68;
  uchar *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uchar *local_38;
  
  local_e0 = (face->root).stream;
  local_130 = local_e0->memory;
  local_100 = face->blend;
  local_d8 = 0;
  if (local_100 == (GX_Blend)0x0 || face->doblend == '\0') {
    return 6;
  }
  if (local_100->gv_glyphcnt <= glyph_index) {
    return 0;
  }
  if (local_100->glyphoffsets[glyph_index] == local_100->glyphoffsets[(ulong)glyph_index + 1]) {
    return 0;
  }
  uVar30 = (ulong)n_points;
  local_90 = outline;
  pFVar12 = (FT_Vector *)ft_mem_realloc(local_130,0x10,0,uVar30,(void *)0x0,&local_138);
  pFVar18 = local_130;
  pFVar13 = (FT_Bool *)0x0;
  pFVar27 = (FT_Vector *)0x0;
  if (local_138 != 0) goto LAB_001713b7;
  local_128 = pFVar12;
  local_108 = (ulong)n_points;
  local_e8 = (FT_Vector *)ft_mem_realloc(local_130,0x10,0,uVar30,(void *)0x0,&local_138);
  if (local_138 != 0) {
    pFVar12 = local_128;
    pFVar13 = (FT_Bool *)0x0;
    pFVar27 = local_e8;
    goto LAB_001713b7;
  }
  pFVar13 = (FT_Bool *)ft_mem_realloc(pFVar18,1,0,uVar30,(void *)0x0,&local_138);
  pFVar31 = local_e0;
  pGVar8 = local_100;
  pFVar12 = local_128;
  pFVar18 = local_130;
  pFVar27 = local_e8;
  local_f0 = pFVar13;
  if (((local_138 != 0) ||
      (local_98 = uVar30, local_138 = FT_Stream_Seek(local_e0,local_100->glyphoffsets[glyph_index]),
      pFVar27 = local_e8, pFVar12 = local_128, pFVar18 = local_130, pFVar13 = local_f0,
      local_138 != 0)) ||
     (pFVar4 = pGVar8->glyphoffsets,
     local_138 = FT_Stream_EnterFrame(pFVar31,pFVar4[(ulong)glyph_index + 1] - pFVar4[glyph_index]),
     pFVar18 = local_130, pFVar12 = local_128, pFVar13 = local_f0, local_138 != 0))
  goto LAB_001713b7;
  puVar17 = pFVar31->cursor;
  puVar14 = pFVar31->base;
  local_a0 = (FT_Fixed *)
             ft_mem_realloc(local_130,8,0,(ulong)pGVar8->num_axis,(void *)0x0,&local_138);
  pGVar8 = local_100;
  local_110 = (FT_Fixed *)0x0;
  pFVar16 = (FT_UShort *)0x0;
  pFVar21 = (FT_Fixed *)0x0;
  if (local_138 != 0) goto LAB_00171505;
  local_118 = (FT_Fixed *)
              ft_mem_realloc(pFVar18,8,0,(ulong)local_100->num_axis,(void *)0x0,&local_138);
  if (local_138 == 0) {
    local_110 = (FT_Fixed *)
                ft_mem_realloc(local_130,8,0,(ulong)pGVar8->num_axis,(void *)0x0,&local_138);
    if (local_138 != 0) goto LAB_001714fe;
    local_f8 = (long)puVar17 - (long)puVar14;
    FVar10 = FT_Stream_GetUShort(pFVar31);
    FVar11 = FT_Stream_GetUShort(pFVar31);
    pFVar31 = local_e0;
    local_68 = (ulong)(FVar10 & 0xfff);
    uVar30 = pGVar8->gvar_size;
    if (uVar30 < (ulong)FVar11 + local_68 * 4) {
      local_138 = 8;
      pFVar16 = (FT_UShort *)0x0;
      pFVar21 = local_118;
      goto LAB_00171505;
    }
    local_f8 = local_f8 + FVar11;
    if ((short)FVar10 < 0) {
      puVar17 = local_e0->base;
      uVar29 = (long)local_e0->cursor - (long)puVar17;
      puVar14 = puVar17 + local_f8;
      if ((ulong)((long)local_e0->limit - (long)puVar17) <= local_f8) {
        puVar14 = local_e0->limit;
      }
      local_e0->cursor = puVar14;
      local_c0 = ft_var_readpackedpoints(local_e0,uVar30,&local_d8);
      puVar17 = pFVar31->base;
      local_f8 = (long)pFVar31->cursor - (long)puVar17;
      puVar14 = puVar17 + uVar29;
      if ((ulong)((long)pFVar31->limit - (long)puVar17) <= uVar29) {
        puVar14 = pFVar31->limit;
      }
      pFVar31->cursor = puVar14;
    }
    else {
      local_c0 = (FT_UShort *)0x0;
    }
    if ((FT_UInt)local_108 != 0) {
      lVar19 = 0;
      do {
        puVar1 = (undefined8 *)((long)&local_90->points->x + lVar19);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&local_128->x + lVar19);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar19 = lVar19 + 0x10;
      } while (local_98 << 4 != lVar19);
    }
    pFVar31 = local_e0;
    if ((uint)local_68 != 0) {
      local_58 = (ulong)((FT_UInt)local_108 - 4);
      local_40 = (ulong)((FT_UInt)local_108 - 3);
      local_48 = (ulong)((FT_UInt)local_108 - 2);
      local_50 = (ulong)((FT_UInt)local_108 - 1);
      local_70 = local_98 << 4;
      local_b8 = local_50 << 4;
      local_b0 = local_48 << 4;
      local_78 = local_40 << 4;
      local_80 = local_58 << 4;
      uVar30 = 0;
      local_d0 = (FT_UShort *)0x0;
      pFVar21 = local_110;
      tuple_coords = local_a0;
      do {
        local_132 = FT_Stream_GetUShort(pFVar31);
        FVar10 = FT_Stream_GetUShort(pFVar31);
        pGVar8 = local_100;
        local_120 = (FT_Short *)CONCAT44(local_120._4_4_,(uint)FVar10);
        local_a8 = uVar30;
        if ((short)FVar10 < 0) {
          if (local_100->num_axis != 0) {
            uVar30 = 0;
            do {
              FVar10 = FT_Stream_GetUShort(pFVar31);
              tuple_coords[uVar30] = (long)((int)(short)FVar10 << 2);
              uVar30 = uVar30 + 1;
            } while (uVar30 < pGVar8->num_axis);
          }
        }
        else {
          uVar22 = FVar10 & 0xfff;
          if (local_100->tuplecount <= uVar22) {
            local_138 = 8;
            break;
          }
          memcpy(tuple_coords,local_100->tuplecoords + uVar22 * local_100->num_axis,
                 (ulong)local_100->num_axis << 3);
        }
        pFVar6 = local_118;
        if ((((uint)local_120 >> 0xe & 1) != 0) && (pGVar8->num_axis != 0)) {
          uVar30 = 0;
          do {
            FVar10 = FT_Stream_GetUShort(pFVar31);
            pFVar21 = local_110;
            pFVar6[uVar30] = (long)((int)(short)FVar10 << 2);
            uVar30 = uVar30 + 1;
          } while (uVar30 < pGVar8->num_axis);
          if (pGVar8->num_axis != 0) {
            uVar30 = 0;
            do {
              FVar10 = FT_Stream_GetUShort(pFVar31);
              pFVar21[uVar30] = (long)((int)(short)FVar10 << 2);
              uVar30 = uVar30 + 1;
            } while (uVar30 < pGVar8->num_axis);
          }
        }
        uVar22 = (uint)local_120;
        FVar15 = ft_var_apply_tuple(pGVar8,(FT_UShort)local_120,tuple_coords,local_118,pFVar21);
        if (FVar15 == 0) {
          iVar28 = (int)local_a8;
          FVar10 = local_132;
        }
        else {
          local_38 = pFVar31->base;
          local_60 = pFVar31->cursor;
          puVar17 = local_38 + local_f8;
          if ((ulong)((long)pFVar31->limit - (long)local_38) <= local_f8) {
            puVar17 = pFVar31->limit;
          }
          pFVar31->cursor = puVar17;
          local_88 = FVar15;
          if ((uVar22 >> 0xd & 1) == 0) {
            local_d4 = local_d8;
            pFVar16 = local_c0;
          }
          else {
            pFVar16 = ft_var_readpackedpoints(pFVar31,local_100->gvar_size,&local_d4);
            local_d0 = pFVar16;
          }
          uVar22 = local_d4;
          pGVar8 = local_100;
          delta_cnt = local_d4;
          if (local_d4 == 0) {
            delta_cnt = (FT_UInt)local_108;
          }
          local_c8 = ft_var_readpackeddeltas(pFVar31,local_100->gvar_size,delta_cnt);
          local_120 = ft_var_readpackeddeltas(pFVar31,pGVar8->gvar_size,delta_cnt);
          pFVar9 = local_90;
          pFVar12 = local_e8;
          pFVar27 = local_128;
          if (((pFVar16 != (FT_UShort *)0x0) && (local_120 != (FT_Short *)0x0)) &&
             (local_c8 != (FT_Short *)0x0)) {
            uVar7 = (FT_UInt)local_108;
            if (pFVar16 == (FT_UShort *)0xffffffffffffffff) {
              if ((FT_UInt)local_108 != 0) {
                lVar19 = 8;
                uVar30 = 0;
                do {
                  lVar23 = (long)local_c8[uVar30] * (long)(int)local_88;
                  lVar23 = lVar23 + 0x8000 + (lVar23 >> 0x3f) >> 0x10;
                  lVar20 = (long)local_120[uVar30] * (long)(int)local_88;
                  lVar20 = lVar20 + 0x8000 + (lVar20 >> 0x3f) >> 0x10;
                  if (uVar30 < local_58) {
                    pFVar27 = local_90->points;
                    plVar26 = (long *)((long)pFVar27 + lVar19 + -8);
                    *plVar26 = *plVar26 + lVar23;
                    plVar26 = (long *)((long)&pFVar27->x + lVar19);
                    lVar23 = lVar20;
LAB_00171bbb:
                    *plVar26 = *plVar26 + lVar23;
                  }
                  else {
                    if ((uVar30 == local_58) && ((face->variation_support & 4) == 0)) {
                      plVar26 = (long *)((long)&local_90->points->x + local_80);
                      goto LAB_00171bbb;
                    }
                    if ((local_40 == uVar30) && ((face->variation_support & 2) == 0)) {
                      plVar26 = (long *)((long)&local_90->points->x + local_78);
                      goto LAB_00171bbb;
                    }
                    if ((local_48 == uVar30) && ((face->variation_support & 0x20) == 0)) {
                      pFVar27 = local_90->points;
                      lVar23 = local_b0;
LAB_00171bb4:
                      plVar26 = (long *)((long)&pFVar27->y + lVar23);
                      lVar23 = lVar20;
                      goto LAB_00171bbb;
                    }
                    if ((local_50 == uVar30) && ((face->variation_support & 0x10) == 0)) {
                      pFVar27 = local_90->points;
                      lVar23 = local_b8;
                      goto LAB_00171bb4;
                    }
                  }
                  uVar30 = uVar30 + 1;
                  lVar19 = lVar19 + 0x10;
                } while (local_98 != uVar30);
              }
            }
            else {
              if ((FT_UInt)local_108 != 0) {
                lVar19 = 0;
                pFVar13 = local_f0;
                do {
                  *pFVar13 = '\0';
                  puVar1 = (undefined8 *)((long)&local_128->x + lVar19);
                  uVar5 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&local_e8->x + lVar19);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar5;
                  pFVar13 = pFVar13 + 1;
                  lVar19 = lVar19 + 0x10;
                } while (local_70 != lVar19);
              }
              if (uVar22 != 0) {
                uVar30 = 0;
                do {
                  uVar3 = pFVar16[uVar30];
                  if (uVar3 < (FT_UInt)local_108) {
                    local_f0[uVar3] = '\x01';
                    lVar19 = (long)local_c8[uVar30] * (long)(int)local_88;
                    local_e8[uVar3].x =
                         local_e8[uVar3].x + (lVar19 + 0x8000 + (lVar19 >> 0x3f) >> 0x10);
                    lVar19 = (long)local_120[uVar30] * (long)(int)local_88;
                    local_e8[uVar3].y =
                         local_e8[uVar3].y + (lVar19 + 0x8000 + (lVar19 >> 0x3f) >> 0x10);
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar22 != uVar30);
              }
              tt_interpolate_deltas(local_90,local_e8,local_128,local_f0);
              pFVar31 = local_e0;
              if (uVar7 != 0) {
                lVar19 = 0;
                uVar30 = 0;
                do {
                  lVar23 = *(long *)((long)&pFVar12->x + lVar19) -
                           *(long *)((long)&pFVar27->x + lVar19);
                  lVar20 = *(long *)((long)&pFVar12->y + lVar19) -
                           *(long *)((long)&pFVar27->y + lVar19);
                  if (uVar30 < local_58) {
                    plVar25 = (long *)((long)&pFVar9->points->x + lVar19);
                    plVar26 = plVar25 + 1;
                    *plVar25 = *plVar25 + lVar23;
                    lVar23 = lVar20;
LAB_00171ab0:
                    *plVar26 = *plVar26 + lVar23;
                  }
                  else {
                    if ((local_80 == lVar19) && ((face->variation_support & 4) == 0)) {
                      plVar26 = (long *)((long)&pFVar9->points->x + local_80);
                      goto LAB_00171ab0;
                    }
                    if ((local_78 == lVar19) && ((face->variation_support & 2) == 0)) {
                      plVar26 = (long *)((long)&pFVar9->points->x + local_78);
                      goto LAB_00171ab0;
                    }
                    if ((local_b0 == lVar19) && ((face->variation_support & 0x20) == 0)) {
                      pFVar24 = pFVar9->points;
                      lVar23 = local_b0;
LAB_00171aa9:
                      plVar26 = (long *)((long)&pFVar24->y + lVar23);
                      lVar23 = lVar20;
                      goto LAB_00171ab0;
                    }
                    if ((local_b8 == lVar19) && ((face->variation_support & 0x10) == 0)) {
                      pFVar24 = pFVar9->points;
                      lVar23 = local_b8;
                      goto LAB_00171aa9;
                    }
                  }
                  uVar30 = uVar30 + 1;
                  lVar19 = lVar19 + 0x10;
                } while (local_70 != lVar19);
              }
            }
          }
          pFVar18 = local_130;
          if (local_d0 == (FT_UShort *)0xffffffffffffffff) {
            local_d0 = (FT_UShort *)0xffffffffffffffff;
          }
          else {
            ft_mem_free(local_130,local_d0);
            local_d0 = (FT_UShort *)0x0;
          }
          FVar10 = local_132;
          iVar28 = (int)local_a8;
          uVar30 = (long)local_60 - (long)local_38;
          ft_mem_free(pFVar18,local_c8);
          ft_mem_free(pFVar18,local_120);
          puVar17 = pFVar31->base + uVar30;
          if ((ulong)((long)pFVar31->limit - (long)pFVar31->base) <= uVar30) {
            puVar17 = pFVar31->limit;
          }
          pFVar31->cursor = puVar17;
          pFVar21 = local_110;
          tuple_coords = local_a0;
        }
        local_f8 = local_f8 + FVar10;
        uVar30 = (ulong)(iVar28 + 1U);
      } while (iVar28 + 1U != (uint)local_68);
    }
    pFVar16 = local_c0;
    pFVar21 = local_118;
    if (local_c0 != (FT_UShort *)0xffffffffffffffff) goto LAB_00171505;
  }
  else {
    local_110 = (FT_Fixed *)0x0;
LAB_001714fe:
    pFVar16 = (FT_UShort *)0x0;
    pFVar21 = local_118;
LAB_00171505:
    ft_mem_free(local_130,pFVar16);
  }
  ft_mem_free(local_130,local_a0);
  ft_mem_free(local_130,pFVar21);
  ft_mem_free(local_130,local_110);
  FT_Stream_ExitFrame(pFVar31);
  pFVar12 = local_128;
  pFVar18 = local_130;
  pFVar13 = local_f0;
  pFVar27 = local_e8;
LAB_001713b7:
  ft_mem_free(pFVar18,pFVar12);
  ft_mem_free(pFVar18,pFVar27);
  ft_mem_free(pFVar18,pFVar13);
  return local_138;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Vary_Apply_Glyph_Deltas( TT_Face      face,
                              FT_UInt      glyph_index,
                              FT_Outline*  outline,
                              FT_UInt      n_points )
  {
    FT_Stream   stream = face->root.stream;
    FT_Memory   memory = stream->memory;
    GX_Blend    blend  = face->blend;

    FT_Vector*  points_org = NULL;
    FT_Vector*  points_out = NULL;
    FT_Bool*    has_delta  = NULL;

    FT_Error    error;
    FT_ULong    glyph_start;
    FT_UInt     tupleCount;
    FT_ULong    offsetToData;
    FT_ULong    here;
    FT_UInt     i, j;
    FT_Fixed*   tuple_coords    = NULL;
    FT_Fixed*   im_start_coords = NULL;
    FT_Fixed*   im_end_coords   = NULL;
    FT_UInt     point_count, spoint_count = 0;
    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;
    FT_Short    *deltas_x, *deltas_y;


    if ( !face->doblend || !blend )
      return FT_THROW( Invalid_Argument );

    if ( glyph_index >= blend->gv_glyphcnt      ||
         blend->glyphoffsets[glyph_index] ==
           blend->glyphoffsets[glyph_index + 1] )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " no variation data for this glyph\n" ));
      return FT_Err_Ok;
    }

    if ( FT_NEW_ARRAY( points_org, n_points ) ||
         FT_NEW_ARRAY( points_out, n_points ) ||
         FT_NEW_ARRAY( has_delta, n_points )  )
      goto Fail1;

    if ( FT_STREAM_SEEK( blend->glyphoffsets[glyph_index] )   ||
         FT_FRAME_ENTER( blend->glyphoffsets[glyph_index + 1] -
                           blend->glyphoffsets[glyph_index] ) )
      goto Fail1;

    glyph_start = FT_Stream_FTell( stream );

    /* each set of glyph variation data is formatted similarly to `cvar' */

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto Fail2;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData + ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 >
           blend->gvar_size )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " invalid glyph variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto Fail2;
    }

    offsetToData += glyph_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              blend->gvar_size,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "gvar: there %s %d tuple%s:\n",
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "is" : "are",
                tupleCount & GX_TC_TUPLE_COUNT_MASK,
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "" : "s" ));

    for ( j = 0; j < n_points; j++ )
      points_org[j] = outline->points[j];

    for ( i = 0; i < ( tupleCount & GX_TC_TUPLE_COUNT_MASK ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_GET_SHORT() * 4;   /* convert from        */
                                                  /* short frac to fixed */
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Fail2;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          &blend->tuplecoords[( tupleIndex & 0xFFF ) * blend->num_axis],
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_GET_SHORT() * 4;
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_GET_SHORT() * 4;
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               blend->gvar_size,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas_x = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );
      deltas_y = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );

      if ( !points || !deltas_y || !deltas_x )
        ; /* failure, ignore it */

      else if ( points == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    point deltas:\n" ));

        /* this means that there are deltas for every point in the glyph */
        for ( j = 0; j < n_points; j++ )
        {
          FT_Pos  delta_x = FT_MulFix( deltas_x[j], apply );
          FT_Pos  delta_y = FT_MulFix( deltas_y[j], apply );


          if ( j < n_points - 4 )
          {
            outline->points[j].x += delta_x;
            outline->points[j].y += delta_y;
          }
          else
          {
            /* To avoid double adjustment of advance width or height, */
            /* adjust phantom points only if there is no HVAR or VVAR */
            /* support, respectively.                                 */
            if ( j == ( n_points - 4 )        &&
                 !( face->variation_support &
                    TT_FACE_FLAG_VAR_LSB    ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 3 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_HADVANCE ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 2 )        &&
                      !( face->variation_support &
                         TT_FACE_FLAG_VAR_TSB    ) )
              outline->points[j].y += delta_y;

            else if ( j == ( n_points - 1 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_VADVANCE ) )
              outline->points[j].y += delta_y;
          }

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( delta_x || delta_y )
          {
            FT_TRACE7(( "      %d: (%d, %d) -> (%d, %d)\n",
                        j,
                        outline->points[j].x - delta_x,
                        outline->points[j].y - delta_y,
                        outline->points[j].x,
                        outline->points[j].y ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        /* we have to interpolate the missing deltas similar to the */
        /* IUP bytecode instruction                                 */
        for ( j = 0; j < n_points; j++ )
        {
          has_delta[j]  = FALSE;
          points_out[j] = points_org[j];
        }

        for ( j = 0; j < point_count; j++ )
        {
          FT_UShort  idx = points[j];


          if ( idx >= n_points )
            continue;

          has_delta[idx] = TRUE;

          points_out[idx].x += FT_MulFix( deltas_x[j], apply );
          points_out[idx].y += FT_MulFix( deltas_y[j], apply );
        }

        /* no need to handle phantom points here,      */
        /* since solitary points can't be interpolated */
        tt_interpolate_deltas( outline,
                               points_out,
                               points_org,
                               has_delta );

        FT_TRACE7(( "    point deltas:\n" ));

        for ( j = 0; j < n_points; j++ )
        {
          FT_Pos  delta_x = points_out[j].x - points_org[j].x;
          FT_Pos  delta_y = points_out[j].y - points_org[j].y;


          if ( j < n_points - 4 )
          {
            outline->points[j].x += delta_x;
            outline->points[j].y += delta_y;
          }
          else
          {
            /* To avoid double adjustment of advance width or height, */
            /* adjust phantom points only if there is no HVAR or VVAR */
            /* support, respectively.                                 */
            if ( j == ( n_points - 4 )        &&
                 !( face->variation_support &
                    TT_FACE_FLAG_VAR_LSB    ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 3 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_HADVANCE ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 2 )        &&
                      !( face->variation_support &
                         TT_FACE_FLAG_VAR_TSB    ) )
              outline->points[j].y += delta_y;

            else if ( j == ( n_points - 1 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_VADVANCE ) )
              outline->points[j].y += delta_y;
          }

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( delta_x || delta_y )
          {
            FT_TRACE7(( "      %d: (%d, %d) -> (%d, %d)\n",
                        j,
                        outline->points[j].x - delta_x,
                        outline->points[j].y - delta_y,
                        outline->points[j].x,
                        outline->points[j].y ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas_x );
      FT_FREE( deltas_y );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

  Fail2:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    FT_FRAME_EXIT();

  Fail1:
    FT_FREE( points_org );
    FT_FREE( points_out );
    FT_FREE( has_delta );

    return error;
  }